

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

int __thiscall
QTextDocumentPrivate::remove_string(QTextDocumentPrivate *this,int pos,uint length,Operation op)

{
  long *plVar1;
  uint uVar2;
  uint z;
  QObject *object;
  QTextFrame *pQVar3;
  ulong uVar4;
  
  uVar2 = QFragmentMapData<QTextBlockData>::findNode(&(this->blocks).data,pos,0);
  z = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos,0);
  QFragmentMap<QTextBlockData>::setSize
            (&this->blocks,uVar2,
             (this->blocks).data.field_0.fragments[uVar2].super_QFragment<3>.size_array[0] - length,
             0);
  uVar4 = (ulong)z;
  object = &objectForFormat(this,(this->fragments).data.field_0.fragments[uVar4].format)->
            super_QObject;
  pQVar3 = QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(object);
  if (pQVar3 != (QTextFrame *)0x0) {
    plVar1 = *(long **)&(pQVar3->super_QTextObject).field_0x8;
    (**(code **)(*plVar1 + 0x28))
              (plVar1,(this->text).d.ptr
                      [(this->fragments).data.field_0.fragments[uVar4].stringPosition],uVar4);
    this->framesDirty = true;
  }
  uVar2 = QFragmentMapData<QTextFragmentData>::erase_single(&(this->fragments).data,z);
  if (this->undoEnabled == false) {
    this->unreachableCharacterCount = this->unreachableCharacterCount + length;
  }
  adjustDocumentChangesAndCursors(this,pos,-length,op);
  return uVar2;
}

Assistant:

int QTextDocumentPrivate::remove_string(int pos, uint length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(q20::cmp_greater_equal(blocks.length(), pos+length));

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(blocks.size(b) > length);
    Q_ASSERT(x && q20::cmp_equal(fragments.position(x), pos) && fragments.size(x) == length);
    Q_ASSERT(noBlockInString(QStringView{text}.mid(fragments.fragment(x)->stringPosition, length)));

    blocks.setSize(b, blocks.size(b)-length);

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    const int w = fragments.erase_single(x);

    if (!undoEnabled)
        unreachableCharacterCount += length;

    adjustDocumentChangesAndCursors(pos, -int(length), op);

    return w;
}